

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::_Redirect(HttpSocket *this,string *loc,bool forceGET)

{
  string *host;
  bool bVar1;
  Request req;
  undefined1 local_108 [128];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int local_68 [2];
  void *local_60;
  bool local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (loc->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    local_108._0_8_ = local_108 + 0x10;
    local_108._8_8_ = 0;
    local_108[0x10] = '\0';
    local_108._32_8_ = local_108 + 0x30;
    local_108._40_8_ = 0;
    local_108[0x30] = '\0';
    local_108._64_8_ = local_108 + 0x50;
    local_108._72_8_ = 0;
    local_108[0x50] = '\0';
    local_108._96_8_ = local_108 + 0x70;
    local_108._104_8_ = 0;
    local_108[0x70] = '\0';
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_68[0] = 0x50;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_60 = (this->_curRequest).user;
    local_58[0] = (this->_curRequest).useSSL;
    local_88._M_p = (pointer)&local_78;
    local_50._M_p = (pointer)&local_40;
    if (!forceGET) {
      std::__cxx11::string::_M_assign((string *)&local_50);
    }
    host = (string *)(local_108 + 0x20);
    SplitURI(loc,(string *)local_108,host,(string *)(local_108 + 0x60),local_68,local_58);
    if (local_108._8_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)host);
      std::__cxx11::string::_M_assign((string *)(local_108 + 0x60));
    }
    if (local_108._40_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)host);
    }
    if (local_68[0] < 0) {
      local_68[0] = (this->_curRequest).port;
    }
    std::__cxx11::string::_M_assign((string *)&local_88);
    bVar1 = SendRequest(this,(Request *)local_108,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,
                      CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_108._96_8_ != local_108 + 0x70) {
      operator_delete((void *)local_108._96_8_,CONCAT71(local_108._113_7_,local_108[0x70]) + 1);
    }
    if ((undefined1 *)local_108._64_8_ != local_108 + 0x50) {
      operator_delete((void *)local_108._64_8_,CONCAT71(local_108._81_7_,local_108[0x50]) + 1);
    }
    if ((undefined1 *)local_108._32_8_ != local_108 + 0x30) {
      operator_delete((void *)local_108._32_8_,CONCAT71(local_108._49_7_,local_108[0x30]) + 1);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
    }
  }
  return bVar1;
}

Assistant:

void HttpSocket::_FinishRequest(void)
{
    traceprint("HttpSocket::_FinishRequest\n");
    if(_inProgress)
    {
        traceprint("... in progress. redirecting = %d\n", IsRedirecting());
        if(!IsRedirecting() || _alwaysHandle)
            _OnRequestDone(); // notify about finished request
        _inProgress = false;
        _hdrs.clear();
        if(_mustClose)
            close();
    }
}